

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevT.cpp
# Opt level: O0

void __thiscall OpenMD::ChebyshevT::GenerateFirstTwoTerms(ChebyshevT *this)

{
  DoublePolynomial t1;
  DoublePolynomial t0;
  double *coefficient;
  value_type *in_stack_ffffffffffffff78;
  value_type *__x;
  Polynomial<double> *in_stack_ffffffffffffff80;
  double local_38 [7];
  
  coefficient = local_38;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x31151a);
  Polynomial<double>::setCoefficient
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x31155a);
  __x = (value_type *)0x3ff0000000000000;
  Polynomial<double>::setCoefficient(in_stack_ffffffffffffff80,0x3ff00000,coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,__x);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x31159f);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x3115a9);
  return;
}

Assistant:

void ChebyshevT::GenerateFirstTwoTerms() {
    DoublePolynomial t0;
    t0.setCoefficient(0, 1.0);
    polyList_.push_back(t0);

    DoublePolynomial t1;
    t1.setCoefficient(1, 1.0);
    polyList_.push_back(t1);
  }